

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePoly.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLinePoly::ArchiveOUT(ChLinePoly *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_30;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLinePoly>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_30._value = &this->points;
  local_30._name = "points";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->degree;
  local_48._name = "degree";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinePoly::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinePoly>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(points);
    marchive << CHNVP(degree);
}